

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O2

void routine(void *arg)

{
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  char *in_RCX;
  int sock;
  int sock_00;
  
  iVar1 = nn_socket(1,0x21);
  if (-1 < iVar1) {
    test_connect_impl((char *)0x32,iVar1,sock,in_RCX);
    test_close_impl((char *)0x33,iVar1,sock_00);
    return;
  }
  iVar1 = nn_errno();
  __stream = _stderr;
  if (iVar1 == 0x18) {
    return;
  }
  puVar2 = (uint *)__errno_location();
  pcVar3 = nn_err_strerror(*puVar2);
  fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc_shutdown.c"
          ,0x31);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void routine (NN_UNUSED void *arg)
{
    int s;

    s = nn_socket (AF_SP, NN_SUB);
    if (s < 0 && nn_errno () == EMFILE)
        return;
    errno_assert (s >= 0);
    test_connect (s, SOCKET_ADDRESS);
    test_close (s);
}